

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O2

QList<QPointer<QObject>_> * __thiscall
QPointerEvent::passiveGrabbers
          (QList<QPointer<QObject>_> *__return_storage_ptr__,QPointerEvent *this,QEventPoint *point)

{
  QPointingDevicePrivate *this_00;
  int id;
  EventPointData *pEVar1;
  QDebug *pQVar2;
  long in_FS_OFFSET;
  QDebug local_48;
  QEventPoint local_40;
  undefined1 local_38 [8];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPointingDevicePrivate **)&((this->super_QInputEvent).m_dev)->field_0x8;
  id = QEventPoint::id(point);
  pEVar1 = QPointingDevicePrivate::queryPointById(this_00,id);
  if (pEVar1 == (EventPointData *)0x0) {
    QMessageLogger::warning();
    pQVar2 = QDebug::operator<<(&local_48,"point is not in activePoints");
    local_40.d.d.ptr = (QExplicitlySharedDataPointer<QEventPointPrivate>)pQVar2->stream;
    *(int *)((long)local_40.d.d.ptr + 0x28) = *(int *)((long)local_40.d.d.ptr + 0x28) + 1;
    ::operator<<((Stream *)local_38,&local_40);
    QDebug::~QDebug((QDebug *)local_38);
    QDebug::~QDebug((QDebug *)&local_40);
    QDebug::~QDebug(&local_48);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QPointer<QObject> *)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_0029f1aa;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_0029f1aa:
      __stack_chk_fail();
    }
    QArrayDataPointer<QPointer<QObject>_>::QArrayDataPointer
              (&__return_storage_ptr__->d,&(pEVar1->passiveGrabbers).d);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QPointer<QObject> > QPointerEvent::passiveGrabbers(const QEventPoint &point) const
{
    Q_ASSERT(pointingDevice());
    auto persistentPoint = QPointingDevicePrivate::get(pointingDevice())->queryPointById(point.id());
    if (Q_UNLIKELY(!persistentPoint)) {
        qWarning() << "point is not in activePoints" << point;
        return {};
    }
    return persistentPoint->passiveGrabbers;
}